

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint32_t farmhashcc::Hash32(char *s,size_t len)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  int iVar8;
  uint32_t uVar9;
  ulong in_RSI;
  char *in_RDI;
  uint32_t a4_1;
  uint32_t a3_1;
  uint32_t a2_1;
  uint32_t a1_1;
  uint32_t a0_1;
  size_t iters;
  uint32_t a4;
  uint32_t a3;
  uint32_t a2;
  uint32_t a1;
  uint32_t a0;
  uint32_t f;
  uint32_t g;
  uint32_t h;
  uint32_t local_5c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ulong local_40;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_24;
  uint local_20;
  uint local_1c;
  ulong local_18;
  char *local_10;
  uint32_t local_4;
  
  if (in_RSI < 0x19) {
    if (in_RSI < 0xd) {
      if (in_RSI < 5) {
        local_5c = Hash32Len0to4((char *)CONCAT44(in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0),
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      else {
        local_5c = Hash32Len5to12((char *)CONCAT44(in_stack_ffffffffffffffb4,
                                                   in_stack_ffffffffffffffb0),
                                  CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
    }
    else {
      local_5c = Hash32Len13to24((char *)CONCAT44(in_stack_ffffffffffffffd4,
                                                  in_stack_ffffffffffffffd0),
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    local_4 = local_5c;
  }
  else {
    local_1c = (uint)in_RSI;
    local_24 = local_1c * -0x3361d2af;
    local_20 = local_24;
    local_18 = in_RSI;
    local_10 = in_RDI;
    util::Fetch32(in_RDI + (in_RSI - 4));
    uVar1 = util::Rotate32(0,0x2b00f0);
    util::Fetch32(local_10 + (local_18 - 8));
    uVar2 = util::Rotate32(0,0x2b011d);
    uVar3 = uVar2 * 0x1b873593;
    util::Fetch32(local_10 + (local_18 - 0x10));
    uVar2 = util::Rotate32(0,0x2b014a);
    uVar4 = uVar2 * 0x1b873593;
    util::Fetch32(local_10 + (local_18 - 0xc));
    uVar2 = util::Rotate32(0,0x2b0177);
    uVar5 = uVar2 * 0x1b873593;
    util::Fetch32(local_10 + (local_18 - 0x14));
    uVar2 = util::Rotate32(0,0x2b01a4);
    iVar6 = uVar2 * 0x1b873593;
    local_1c = uVar1 * 0x1b873593 ^ local_1c;
    uVar1 = util::Rotate32(0,0x2b01c8);
    local_1c = uVar4 ^ uVar1 * 5 + 0xe6546b64;
    uVar1 = util::Rotate32(0,0x2b01f4);
    local_1c = uVar1 * 5 + 0xe6546b64;
    local_20 = uVar3 ^ local_20;
    uVar1 = util::Rotate32(0,0x2b0220);
    local_20 = uVar5 ^ uVar1 * 5 + 0xe6546b64;
    uVar1 = util::Rotate32(0,0x2b024c);
    local_20 = uVar1 * 5 + 0xe6546b64;
    local_24 = iVar6 + local_24;
    uVar1 = util::Rotate32(0,0x2b0278);
    local_24 = uVar1 * 5 + 0xe6546b64;
    local_40 = (local_18 - 1) / 0x14;
    do {
      util::Fetch32(local_10);
      uVar1 = util::Rotate32(0,0x2b02bc);
      uVar2 = util::Fetch32(local_10 + 4);
      util::Fetch32(local_10 + 8);
      uVar7 = util::Rotate32(0,0x2b02f6);
      iVar6 = uVar7 * 0x1b873593;
      util::Fetch32(local_10 + 0xc);
      uVar7 = util::Rotate32(0,0x2b031e);
      iVar8 = uVar7 * 0x1b873593;
      uVar7 = util::Fetch32(local_10 + 0x10);
      local_1c = uVar1 * 0x1b873593 ^ local_1c;
      uVar9 = util::Rotate32(0,0x2b0354);
      local_1c = uVar9 * 5 + 0xe6546b64;
      local_24 = uVar2 + local_24;
      uVar9 = util::Rotate32(0,0x2b0380);
      local_24 = uVar9 * -0x3361d2af;
      local_20 = iVar6 + local_20;
      uVar9 = util::Rotate32(0,0x2b03aa);
      local_20 = uVar9 * 5 + 0xe6546b64;
      local_1c = iVar8 + uVar2 ^ local_1c;
      uVar2 = util::Rotate32(0,0x2b03da);
      local_1c = uVar2 * 5 + 0xe6546b64;
      local_20 = uVar7 ^ local_20;
      uVar2 = util::Bswap32(0);
      local_20 = uVar2 * 5;
      local_1c = uVar7 * 5 + local_1c;
      local_1c = util::Bswap32(0);
      local_24 = uVar1 * 0x1b873593 + local_24;
      std::swap<unsigned_int>(&local_24,&local_1c);
      std::swap<unsigned_int>(&local_24,&local_20);
      local_10 = local_10 + 0x14;
      local_40 = local_40 - 1;
    } while (local_40 != 0);
    uVar1 = util::Rotate32(0,0x2b0480);
    local_20 = uVar1 * -0x3361d2af;
    uVar1 = util::Rotate32(0,0x2b0498);
    local_20 = uVar1 * -0x3361d2af;
    uVar1 = util::Rotate32(0,0x2b04b0);
    local_24 = uVar1 * -0x3361d2af;
    uVar1 = util::Rotate32(0,0x2b04c8);
    local_24 = uVar1 * -0x3361d2af;
    uVar1 = util::Rotate32(0,0x2b04e4);
    local_1c = uVar1 * 5 + 0xe6546b64;
    uVar1 = util::Rotate32(0,0x2b0504);
    local_1c = uVar1 * -0x3361d2af;
    uVar1 = util::Rotate32(0,0x2b0520);
    local_1c = uVar1 * 5 + 0xe6546b64;
    local_4 = util::Rotate32(0,0x2b0540);
    local_4 = local_4 * -0x3361d2af;
  }
  return local_4;
}

Assistant:

uint32_t Hash32(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? Hash32Len0to4(s, len) : Hash32Len5to12(s, len)) :
        Hash32Len13to24(s, len);
  }

  // len > 24
  uint32_t h = len, g = c1 * len, f = g;
  uint32_t a0 = Rotate(Fetch(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = Rotate(Fetch(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = Rotate(Fetch(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = Rotate(Fetch(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = Rotate(Fetch(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = Rotate(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = Rotate(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = Rotate(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = Rotate(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = Rotate(f, 19);
  f = f * 5 + 0xe6546b64;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t a0 = Rotate(Fetch(s) * c1, 17) * c2;
    uint32_t a1 = Fetch(s + 4);
    uint32_t a2 = Rotate(Fetch(s + 8) * c1, 17) * c2;
    uint32_t a3 = Rotate(Fetch(s + 12) * c1, 17) * c2;
    uint32_t a4 = Fetch(s + 16);
    h ^= a0;
    h = Rotate(h, 18);
    h = h * 5 + 0xe6546b64;
    f += a1;
    f = Rotate(f, 19);
    f = f * c1;
    g += a2;
    g = Rotate(g, 18);
    g = g * 5 + 0xe6546b64;
    h ^= a3 + a1;
    h = Rotate(h, 19);
    h = h * 5 + 0xe6546b64;
    g ^= a4;
    g = Bswap(g) * 5;
    h += a4 * 5;
    h = Bswap(h);
    f += a0;
    PERMUTE3(f, h, g);
    s += 20;
  } while (--iters != 0);
  g = Rotate(g, 11) * c1;
  g = Rotate(g, 17) * c1;
  f = Rotate(f, 11) * c1;
  f = Rotate(f, 17) * c1;
  h = Rotate(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate(h, 17) * c1;
  h = Rotate(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate(h, 17) * c1;
  return h;
}